

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore.cpp
# Opt level: O1

bool __thiscall QSystemSemaphore::release(QSystemSemaphore *this,int n)

{
  bool bVar1;
  long in_FS_OFFSET;
  anon_class_16_2_f7a091fc local_20;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == 0) {
    bVar1 = true;
  }
  else if (n < 0) {
    release();
    bVar1 = false;
  }
  else {
    local_20.this =
         (this->d)._M_t.
         super___uniq_ptr_impl<QSystemSemaphorePrivate,_std::default_delete<QSystemSemaphorePrivate>_>
         ._M_t.
         super__Tuple_impl<0UL,_QSystemSemaphorePrivate_*,_std::default_delete<QSystemSemaphorePrivate>_>
         .super__Head_base<0UL,_QSystemSemaphorePrivate_*,_false>._M_head_impl;
    local_20.count = &local_c;
    local_c = n;
    bVar1 = QtIpcCommon::
            IpcStorageVariant<&QSystemSemaphorePrivate::Backend::posix,&QSystemSemaphorePrivate::Backend::sysv,&QSystemSemaphorePrivate::Backend::win32>
            ::visit_internal<QSystemSemaphorePrivate::modifySemaphore(int)::_lambda(auto:1)_1_>
                      (&((local_20.this)->backend).d,
                       ((TypeAndFlags *)((long)&(local_20.this)->nativeKey + 0x20))->type,&local_20)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSystemSemaphore::release(int n)
{
    if (n == 0)
        return true;
    if (n < 0) {
        qWarning("QSystemSemaphore::release: n is negative.");
        return false;
    }
    return d->modifySemaphore(n);
}